

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O2

void __thiscall xercesc_4_0::ElemStack::ElemStack(ElemStack *this,MemoryManager *manager)

{
  int iVar1;
  undefined4 extraout_var;
  ValueVectorOf<xercesc_4_0::PrefMapElem_*> *this_00;
  
  this->fEmptyNamespaceId = 0;
  this->fGlobalPoolId = 0;
  XMLStringPool::XMLStringPool(&this->fPrefixPool,0x6d,manager);
  this->fGlobalNamespaces = (StackElem *)0x0;
  this->fStack = (StackElem **)0x0;
  this->fStackCapacity = 0x20;
  this->fNamespaceMap = (ValueVectorOf<xercesc_4_0::PrefMapElem_*> *)0x0;
  this->fStackTop = 0;
  this->fUnknownNamespaceId = 0;
  this->fXMLNamespaceId = 0;
  this->fXMLNamespaceId = 0;
  this->fXMLPoolId = 0;
  this->fXMLNSNamespaceId = 0;
  this->fXMLNSPoolId = 0;
  this->fMemoryManager = manager;
  iVar1 = (*manager->_vptr_MemoryManager[3])(manager);
  this->fStack = (StackElem **)CONCAT44(extraout_var,iVar1);
  memset((StackElem **)CONCAT44(extraout_var,iVar1),0,this->fStackCapacity << 3);
  this_00 = (ValueVectorOf<xercesc_4_0::PrefMapElem_*> *)
            XMemory::operator_new(0x28,this->fMemoryManager);
  ValueVectorOf<xercesc_4_0::PrefMapElem_*>::ValueVectorOf(this_00,0x10,this->fMemoryManager,false);
  this->fNamespaceMap = this_00;
  return;
}

Assistant:

ElemStack::ElemStack(MemoryManager* const manager) :

    fEmptyNamespaceId(0)
    , fGlobalPoolId(0)
    , fPrefixPool(109, manager)
    , fGlobalNamespaces(0)
    , fStack(0)
    , fStackCapacity(32)
    , fStackTop(0)
    , fUnknownNamespaceId(0)
    , fXMLNamespaceId(0)
    , fXMLPoolId(0)
    , fXMLNSNamespaceId(0)
    , fXMLNSPoolId(0)
    , fNamespaceMap(0)
    , fMemoryManager(manager)
{
    // Do an initial allocation of the stack and zero it out
    fStack = (StackElem**) fMemoryManager->allocate
    (
        fStackCapacity * sizeof(StackElem*)
    );//new StackElem*[fStackCapacity];
    memset(fStack, 0, fStackCapacity * sizeof(StackElem*));

    fNamespaceMap = new (fMemoryManager) ValueVectorOf<PrefMapElem*>(16, fMemoryManager);
}